

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xreq.c
# Opt level: O2

int nn_xreq_create(void *hint,nn_sockbase **sockbase)

{
  nn_xreq *self;
  
  self = (nn_xreq *)nn_alloc_(800);
  if (self != (nn_xreq *)0x0) {
    nn_xreq_init(self,&nn_xreq_sockbase_vfptr,hint);
    *sockbase = (nn_sockbase *)self;
    return 0;
  }
  nn_backtrace_print();
  fprintf(_stderr,"Out of memory (%s:%d)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/xreq.c"
          ,0xd4);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static int nn_xreq_create (void *hint, struct nn_sockbase **sockbase)
{
    struct nn_xreq *self;

    self = nn_alloc (sizeof (struct nn_xreq), "socket (xreq)");
    alloc_assert (self);
    nn_xreq_init (self, &nn_xreq_sockbase_vfptr, hint);
    *sockbase = &self->sockbase;

    return 0;
}